

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 sqlite3_memory_highwater(int resetFlag)

{
  sqlite3_int64 local_20;
  sqlite3_int64 mx;
  sqlite3_int64 res;
  int resetFlag_local;
  
  res._4_4_ = resetFlag;
  sqlite3_status64(0,&mx,&local_20,resetFlag);
  return local_20;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_memory_highwater(int resetFlag){
  sqlite3_int64 res, mx;
  sqlite3_status64(SQLITE_STATUS_MEMORY_USED, &res, &mx, resetFlag);
  return mx;
}